

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

void increment_simple_rowgroup_ctr(j_decompress_ptr cinfo,JDIMENSION rows)

{
  uint in_ESI;
  long in_RDI;
  my_master_ptr_conflict master;
  my_main_ptr_conflict main_ptr;
  JDIMENSION rows_left;
  
  if ((*(int *)(*(long *)(in_RDI + 0x220) + 0x7c) == 0) || (*(int *)(in_RDI + 0x19c) != 2)) {
    *(uint *)(*(long *)(in_RDI + 0x228) + 100) =
         in_ESI / *(uint *)(in_RDI + 0x19c) + *(int *)(*(long *)(in_RDI + 0x228) + 100);
    *(uint *)(in_RDI + 0xa8) =
         (in_ESI - in_ESI % *(uint *)(in_RDI + 0x19c)) + *(int *)(in_RDI + 0xa8);
    read_and_discard_scanlines((j_decompress_ptr)main_ptr,master._4_4_);
  }
  else {
    read_and_discard_scanlines((j_decompress_ptr)main_ptr,master._4_4_);
  }
  return;
}

Assistant:

LOCAL(void)
increment_simple_rowgroup_ctr(j_decompress_ptr cinfo, JDIMENSION rows)
{
  JDIMENSION rows_left;
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  my_master_ptr master = (my_master_ptr)cinfo->master;

  if (master->using_merged_upsample && cinfo->max_v_samp_factor == 2) {
    read_and_discard_scanlines(cinfo, rows);
    return;
  }

  /* Increment the counter to the next row group after the skipped rows. */
  main_ptr->rowgroup_ctr += rows / cinfo->max_v_samp_factor;

  /* Partially skipping a row group would involve modifying the internal state
   * of the upsampler, so read the remaining rows into a dummy buffer instead.
   */
  rows_left = rows % cinfo->max_v_samp_factor;
  cinfo->output_scanline += rows - rows_left;

  read_and_discard_scanlines(cinfo, rows_left);
}